

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-impl-test.cc
# Opt level: O2

void __thiscall FormatTest_FormatErrorCode_Test::TestBody(FormatTest_FormatErrorCode_Test *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *expected;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *buf;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *buf_00;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *buf_01;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *buf_02;
  size_t in_R8;
  char *message;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  char (*format_str) [9];
  long lVar2;
  string_view message_00;
  string_view message_01;
  string_view message_02;
  string_view message_03;
  AssertionResult gtest_ar_3;
  string prefix;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_2;
  string msg;
  size_t size;
  int codes [2];
  string sep;
  memory_buffer buffer;
  
  std::__cxx11::string::string((string *)&msg,"error 42",(allocator *)&buffer);
  std::__cxx11::string::string((string *)&sep,": ",(allocator *)&buffer);
  buffer.super_basic_buffer<char>.ptr_ = buffer.store_;
  buffer.super_basic_buffer<char>.size_ = 0;
  buffer.super_basic_buffer<char>._vptr_basic_buffer = (_func_int **)&PTR_grow_00164fa0;
  buffer.super_basic_buffer<char>.capacity_ = 500;
  fmt::v5::format_to<char[8],,500ul,char>(&buffer,(char (*) [8])"garbage");
  message_00.size_ = in_R8;
  message_00.data_ = (char *)0x4;
  fmt::v5::anon_unknown_10::format_error_code
            ((anon_unknown_10 *)&buffer,(buffer *)0x2a,0x1440a9,message_00);
  std::operator+(&prefix,"test: ",&msg);
  fmt::v5::to_string<char,500ul>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_3,
             (v5 *)&buffer,buf);
  pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_3;
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,"\"test: \" + msg","to_string(buffer)",&prefix,pbVar1);
  std::__cxx11::string::~string((string *)&gtest_ar_3);
  std::__cxx11::string::~string((string *)&prefix);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&prefix);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x14390a;
    }
    else {
      pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-impl-test.cc"
               ,0xb1,(char *)pbVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3,(Message *)&prefix);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&prefix);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  fmt::v5::basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer(&buffer);
  buffer.super_basic_buffer<char>.size_ = 0;
  buffer.super_basic_buffer<char>._vptr_basic_buffer = (_func_int **)&PTR_grow_00164fa0;
  buffer.super_basic_buffer<char>.ptr_ = buffer.store_;
  buffer.super_basic_buffer<char>.capacity_ = 500;
  prefix._M_dataplus._M_p = (pointer)&prefix.field_2;
  std::__cxx11::string::_M_construct
            ((ulong)&prefix,-0xb - ((char)msg._M_string_length + (char)sep._M_string_length));
  message_01.size_ = (size_t)pbVar1;
  message_01.data_ = (char *)prefix._M_string_length;
  fmt::v5::anon_unknown_10::format_error_code
            ((anon_unknown_10 *)&buffer,(buffer *)0x2a,(int)prefix._M_dataplus._M_p,message_01);
  fmt::v5::to_string<char,500ul>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_3,
             (v5 *)&buffer,buf_00);
  expected = &msg;
  pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_3;
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,"msg","to_string(buffer)",expected,pbVar1);
  std::__cxx11::string::~string((string *)&gtest_ar_3);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_3);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x14390a;
    }
    else {
      pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    expected = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xb8;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&size,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-impl-test.cc"
               ,0xb8,(char *)pbVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&size,(Message *)&gtest_ar_3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&size);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_3);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::__cxx11::string::~string((string *)&prefix);
  fmt::v5::basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer(&buffer);
  codes[0] = 0x2a;
  codes[1] = -1;
  for (lVar2 = 0; lVar2 != 8; lVar2 = lVar2 + 4) {
    format_str = (char (*) [9])((long)codes + lVar2);
    fmt::v5::format<char[9],int>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&buffer,
               (v5 *)"error {}",format_str,(int *)expected);
    std::__cxx11::string::operator=((string *)&msg,(string *)&buffer);
    std::__cxx11::string::~string((string *)&buffer);
    buffer.super_basic_buffer<char>.size_ = 0;
    buffer.super_basic_buffer<char>._vptr_basic_buffer = (_func_int **)&PTR_grow_00164fa0;
    buffer.super_basic_buffer<char>.ptr_ = buffer.store_;
    buffer.super_basic_buffer<char>.capacity_ = 500;
    prefix._M_dataplus._M_p = (pointer)&prefix.field_2;
    std::__cxx11::string::_M_construct
              ((ulong)&prefix,-0xc - ((char)msg._M_string_length + (char)sep._M_string_length));
    message_02.size_ = (size_t)pbVar1;
    message_02.data_ = (char *)prefix._M_string_length;
    fmt::v5::anon_unknown_10::format_error_code
              ((anon_unknown_10 *)&buffer,(buffer *)(ulong)*(uint *)*format_str,
               (int)prefix._M_dataplus._M_p,message_02);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar,
                   &prefix,&sep);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_3,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar,
                   &msg);
    fmt::v5::to_string<char,500ul>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&size,
               (v5 *)&buffer,buf_01);
    testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
              ((internal *)&gtest_ar_2,"prefix + sep + msg","to_string(buffer)",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_3,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&size);
    std::__cxx11::string::~string((string *)&size);
    std::__cxx11::string::~string((string *)&gtest_ar_3);
    std::__cxx11::string::~string((string *)&gtest_ar);
    if (gtest_ar_2.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_3);
      message = "";
      if (gtest_ar_2.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        message = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-impl-test.cc"
                 ,0xc2,message);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&gtest_ar_3);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar_3);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_2.message_);
    size = 500;
    gtest_ar._0_8_ = buffer.super_basic_buffer<char>.size_;
    pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar;
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)&gtest_ar_3,"size","buffer.size()",&size,(unsigned_long *)&gtest_ar);
    if (gtest_ar_3.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar);
      pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x14390a;
      if (gtest_ar_3.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((gtest_ar_3.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-impl-test.cc"
                 ,0xc4,(char *)pbVar1);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&gtest_ar);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_3.message_);
    fmt::v5::internal::basic_buffer<char>::resize(&buffer.super_basic_buffer<char>,0);
    std::__cxx11::string::push_back('\0');
    message_03.size_ = (size_t)pbVar1;
    message_03.data_ = (char *)prefix._M_string_length;
    fmt::v5::anon_unknown_10::format_error_code
              ((anon_unknown_10 *)&buffer,(buffer *)(ulong)*(uint *)*format_str,
               (int)prefix._M_dataplus._M_p,message_03);
    fmt::v5::to_string<char,500ul>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_3,
               (v5 *)&buffer,buf_02);
    expected = &msg;
    pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_3;
    testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
              ((internal *)&gtest_ar,"msg","to_string(buffer)",expected,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_3);
    std::__cxx11::string::~string((string *)&gtest_ar_3);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_3);
      pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x14390a;
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      expected = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xc9;
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-impl-test.cc"
                 ,0xc9,(char *)pbVar1);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&gtest_ar_3)
      ;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar_3);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    std::__cxx11::string::~string((string *)&prefix);
    fmt::v5::basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer(&buffer);
  }
  std::__cxx11::string::~string((string *)&sep);
  std::__cxx11::string::~string((string *)&msg);
  return;
}

Assistant:

TEST(FormatTest, FormatErrorCode) {
  std::string msg = "error 42", sep = ": ";
  {
    fmt::memory_buffer buffer;
    format_to(buffer, "garbage");
    fmt::format_error_code(buffer, 42, "test");
    EXPECT_EQ("test: " + msg, to_string(buffer));
  }
  {
    fmt::memory_buffer buffer;
    std::string prefix(
        fmt::inline_buffer_size - msg.size() - sep.size() + 1, 'x');
    fmt::format_error_code(buffer, 42, prefix);
    EXPECT_EQ(msg, to_string(buffer));
  }
  int codes[] = {42, -1};
  for (std::size_t i = 0, n = sizeof(codes) / sizeof(*codes); i < n; ++i) {
    // Test maximum buffer size.
    msg = fmt::format("error {}", codes[i]);
    fmt::memory_buffer buffer;
    std::string prefix(
        fmt::inline_buffer_size - msg.size() - sep.size(), 'x');
    fmt::format_error_code(buffer, codes[i], prefix);
    EXPECT_EQ(prefix + sep + msg, to_string(buffer));
    std::size_t size = fmt::inline_buffer_size;
    EXPECT_EQ(size, buffer.size());
    buffer.resize(0);
    // Test with a message that doesn't fit into the buffer.
    prefix += 'x';
    fmt::format_error_code(buffer, codes[i], prefix);
    EXPECT_EQ(msg, to_string(buffer));
  }
}